

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O1

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneBspTree::items
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsSceneBspTree *this,QRectF *rect,
          bool onlyTopLevelItems)

{
  ulong *puVar1;
  Type TVar2;
  int iVar3;
  Node *pNVar4;
  QList<QGraphicsItem_*> *pQVar5;
  QGraphicsItemPrivate *pQVar6;
  ulong uVar7;
  long lVar8;
  QGraphicsItem **ppQVar9;
  QGraphicsItem *this_00;
  long lVar10;
  add_const_t<QList<QGraphicsItem_*>_> *__range1;
  ulong uVar11;
  long in_FS_OFFSET;
  double dVar12;
  QGraphicsItem *local_40;
  anon_class_16_2_a6e56972 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGraphicsItem **)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_38.foundItems = __return_storage_ptr__;
  local_38.onlyTopLevelItems = onlyTopLevelItems;
  if ((this->nodes).d.size == 0) goto LAB_0062f816;
  pNVar4 = (this->nodes).d.ptr;
  TVar2 = pNVar4->type;
  if (TVar2 == Horizontal) {
    if (rect->yp <= (pNVar4->field_0).offset && (pNVar4->field_0).offset != rect->yp) {
      climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>(this,&local_38,rect,1);
      dVar12 = rect->yp + rect->h;
LAB_0062f7f9:
      if (dVar12 < (pNVar4->field_0).offset) goto LAB_0062f816;
    }
  }
  else {
    if (TVar2 != Vertical) {
      if (TVar2 == Leaf) {
        iVar3 = (pNVar4->field_0).leafIndex;
        pQVar5 = (this->leaves).d.ptr;
        if (pQVar5[iVar3].d.size != 0) {
          uVar11 = 0;
          do {
            this_00 = pQVar5[iVar3].d.ptr[uVar11];
            if ((local_38.onlyTopLevelItems == true) &&
               (((this_00->d_ptr).d)->parent != (QGraphicsItem *)0x0)) {
              this_00 = QGraphicsItem::topLevelItem(this_00);
            }
            pQVar6 = (this_00->d_ptr).d;
            uVar7 = *(ulong *)&pQVar6->field_0x160;
            if (((uint)uVar7 & 0x4020) == 0x20) {
              *(ulong *)&pQVar6->field_0x160 = uVar7 | 0x4000;
              local_40 = this_00;
              QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                        ((QPodArrayOps<QGraphicsItem*> *)local_38.foundItems,0,&local_40);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < (ulong)pQVar5[iVar3].d.size);
        }
      }
      goto LAB_0062f816;
    }
    if (rect->xp <= (pNVar4->field_0).offset && (pNVar4->field_0).offset != rect->xp) {
      climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>(this,&local_38,rect,1);
      dVar12 = rect->xp + rect->w;
      goto LAB_0062f7f9;
    }
  }
  climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>(this,&local_38,rect,2);
LAB_0062f816:
  lVar8 = (__return_storage_ptr__->d).size;
  if (lVar8 != 0) {
    ppQVar9 = (__return_storage_ptr__->d).ptr;
    lVar10 = 0;
    do {
      puVar1 = (ulong *)(*(long *)(*(long *)((long)ppQVar9 + lVar10) + 8) + 0x160);
      *puVar1 = *puVar1 & 0xffffffffffffbfff;
      lVar10 = lVar10 + 8;
    } while (lVar8 << 3 != lVar10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneBspTree::items(const QRectF &rect, bool onlyTopLevelItems) const
{
    QList<QGraphicsItem *> foundItems;
    climbTree([&foundItems, onlyTopLevelItems](QList<QGraphicsItem *> *items) {
        for (int i = 0; i < items->size(); ++i) {
            QGraphicsItem *item = items->at(i);
            if (onlyTopLevelItems && item->d_ptr->parent)
                item = item->topLevelItem();
            if (!item->d_func()->itemDiscovered && item->d_ptr->visible) {
                item->d_func()->itemDiscovered = 1;
                foundItems.prepend(item);
            }
        }
    }, rect);
    // Reset discovery bits.
    for (const auto &foundItem : std::as_const(foundItems))
        foundItem->d_ptr->itemDiscovered = 0;
    return foundItems;
}